

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  Type *pTVar2;
  Type (*paTVar3) [6000];
  long lVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  Type *local_40;
  Type (*local_38) [6000];
  
  printf("Using %d chunks\n",4);
  pTVar2 = v;
  for (lVar7 = 0; lVar7 != 6000; lVar7 = lVar7 + 1) {
    *pTVar2 = (float)(int)lVar7;
    pTVar2 = pTVar2 + 1;
  }
  paTVar3 = mx;
  pTVar2 = result;
  for (lVar7 = 0; lVar7 != 6000; lVar7 = lVar7 + 1) {
    result[lVar7] = 0.0;
    for (lVar6 = 0; lVar6 != 6000; lVar6 = lVar6 + 1) {
      (*paTVar3)[lVar6] = (float)((int)lVar7 + (int)lVar6);
    }
    paTVar3 = paTVar3 + 1;
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  paTVar3 = mx;
  mxv(result,mx,v);
  lVar6 = std::chrono::_V2::system_clock::now();
  for (uVar8 = 0; uVar8 < 6000; uVar8 = uVar8 + 0x5dc) {
    local_40 = pTVar2;
    local_38 = paTVar3;
    depspawn::
    spawn<void_(float_*,_const_float_(*)[6000],_const_float_*),_float_*,_const_float_(*)[6000],_float_(&)[6000]>
              (mxv,&local_40,(float (**) [6000])&local_38,&v);
    local_40 = pTVar2;
    depspawn::spawn<void(float*),float*>(pica,&local_40);
    paTVar3 = paTVar3 + 0x5dc;
    pTVar2 = pTVar2 + 0x5dc;
  }
  depspawn::wait_for_all();
  lVar4 = std::chrono::_V2::system_clock::now();
  dVar10 = (double)(lVar6 - lVar7) / 1000000000.0;
  dVar11 = (double)(lVar4 - lVar6) / 1000000000.0;
  std::operator<<((ostream *)&std::cout,"Serial time: ");
  poVar5 = std::ostream::_M_insert<double>(dVar10);
  std::operator<<(poVar5,"s.  Parallel time: ");
  poVar5 = std::ostream::_M_insert<double>(dVar11);
  std::operator<<(poVar5,"s.\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"Speedup (using ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
  std::operator<<(poVar5," chunks): ");
  poVar5 = std::ostream::_M_insert<double>(dVar10 / dVar11);
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar1 = test();
  poVar5 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar9 = "UNSUCCESSFUL";
  if (bVar1) {
    pcVar9 = "SUCCESSFUL";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar5);
  return (int)!bVar1;
}

Assistant:

int main(int argc, char **argv)
{ int i, j;
  
  assert(!(M % CHUNKS));
  
  printf("Using %d chunks\n", CHUNKS);

  for (i = 0; i < N; i++) {
    v[i] = i;
  }
  
  for (i = 0; i < M; i++) {
    result[i] = 0;
    for( j = 0; j < N; j++)
      mx[i][j] = i + j;
  }
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t0 = std::chrono::high_resolution_clock::now();
  
  mxv(result, mx, v);
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t1 = std::chrono::high_resolution_clock::now();
  
  //matrix - vector product using CHUNKS chunks
  for(i = 0; i < M; i+= BCK) {
    //mxv(result + i, (const Type (*)[N]) &(mx[i][0]), v);
    spawn(mxv, result + i, (const Type (*)[N]) &(mx[i][0]), v);
    //pica(result + i);
    spawn(pica, result + i);
  }
 
  wait_for_all();
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t2 = std::chrono::high_resolution_clock::now();
  
  double serial_time = std::chrono::duration<double>(t1-t0).count();
  double parallel_time = std::chrono::duration<double>(t2-t1).count();
  
  std::cout << "Serial time: " << serial_time << "s.  Parallel time: " << parallel_time << "s.\n";
  std::cout << "Speedup (using " << CHUNKS << " chunks): " <<  (serial_time / parallel_time) << std::endl;
  
  const bool test_ok = test();
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}